

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Patterns.cpp
# Opt level: O0

Pattern * slang::ast::StructurePattern::fromSyntax
                    (StructurePatternSyntax *syntax,Type *targetType,ASTContext *context)

{
  string_view name;
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  StructurePatternMemberSyntax *pSVar4;
  sockaddr *__addr;
  Type *pTVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined8 in_RDX;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *src;
  SourceRange *extraout_RDX_01;
  long in_RDI;
  string_view sVar6;
  StructurePattern *result;
  Pattern *pattern_1;
  FieldSymbol *field;
  Symbol *member;
  string_view memberName;
  NamedStructurePatternMemberSyntax *nspms;
  StructurePatternMemberSyntax *memberSyntax_1;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax> *__range3_1;
  Pattern *pattern;
  PatternSyntax *patternSyntax;
  StructurePatternMemberSyntax *memberSyntax;
  const_iterator __end3;
  const_iterator __begin3;
  SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax> *__range3;
  specific_symbol_iterator<slang::ast::FieldSymbol> it;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_(std::ranges::subrange_kind)0>
  fields;
  SmallVector<slang::ast::StructurePattern::FieldPattern,_4UL> patterns;
  Scope *structScope;
  bool bad;
  Compilation *comp;
  Pattern *in_stack_fffffffffffffcb8;
  Type *in_stack_fffffffffffffcc0;
  iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_false>
  *in_stack_fffffffffffffcc8;
  Scope *in_stack_fffffffffffffcd0;
  SourceRange *args_1;
  undefined7 in_stack_fffffffffffffcf0;
  undefined1 in_stack_fffffffffffffcf7;
  SyntaxNode *in_stack_fffffffffffffd10;
  FieldSymbol *in_stack_fffffffffffffd18;
  Symbol *in_stack_fffffffffffffd20;
  Pattern *local_1b8;
  FieldSymbol *local_1b0;
  not_null<const_slang::ast::FieldSymbol_*> local_1a8;
  not_null<const_slang::ast::Pattern_*> local_1a0;
  Pattern *local_198;
  FieldSymbol *local_190;
  string_view local_188;
  Symbol *local_170;
  string_view local_168;
  NamedStructurePatternMemberSyntax *local_158;
  SyntaxNode *local_150;
  const_iterator local_148;
  const_iterator local_138;
  long local_128;
  Symbol *local_120;
  Pattern *local_118;
  FieldSymbol *local_110;
  not_null<const_slang::ast::FieldSymbol_*> local_108;
  not_null<const_slang::ast::Pattern_*> local_100;
  Pattern *local_f8;
  sockaddr *local_f0;
  SyntaxNode *local_e8;
  const_iterator local_e0;
  const_iterator local_d0;
  long local_c0;
  Symbol *local_b8;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_(std::ranges::subrange_kind)0>
  local_b0 [2];
  SmallVectorBase<slang::ast::StructurePattern::FieldPattern> local_90 [2];
  Scope *local_38;
  byte local_29;
  Compilation *local_28;
  undefined8 local_20;
  long local_10;
  Compilation *local_8;
  span<slang::ast::StructurePattern::FieldPattern,_18446744073709551615UL> *args;
  
  local_20 = in_RDX;
  local_10 = in_RDI;
  local_28 = ASTContext::getCompilation((ASTContext *)0x8fcacc);
  local_29 = 0;
  Type::getCanonicalType(in_stack_fffffffffffffcc0);
  local_38 = Symbol::as<slang::ast::Scope>((Symbol *)0x8fcaf3);
  SmallVector<slang::ast::StructurePattern::FieldPattern,_4UL>::SmallVector
            ((SmallVector<slang::ast::StructurePattern::FieldPattern,_4UL> *)0x8fcb08);
  pSVar4 = slang::syntax::SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax>::
           operator[]((SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax> *)
                      in_stack_fffffffffffffcc0,(size_t)in_stack_fffffffffffffcb8);
  if ((pSVar4->super_SyntaxNode).kind == OrderedStructurePatternMember) {
    local_b0[0] = Scope::membersOfType<slang::ast::FieldSymbol>(in_stack_fffffffffffffcd0);
    local_b8 = (Symbol *)
               std::ranges::
               subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_(std::ranges::subrange_kind)0>
               ::begin(local_b0);
    local_c0 = local_10 + 0x28;
    local_d0 = slang::syntax::SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax>::
               begin((SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax> *)0x8fcbc2);
    local_e0 = slang::syntax::SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax>::end
                         ((SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax> *)
                          0x8fcc01);
    while( true ) {
      bVar2 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax>::iterator_base<const_slang::syntax::StructurePatternMemberSyntax_*>_>
                        ((self_type *)in_stack_fffffffffffffcc0,
                         (iterator_base<const_slang::syntax::StructurePatternMemberSyntax_*> *)
                         in_stack_fffffffffffffcb8);
      src = extraout_RDX;
      if (((bVar2 ^ 0xffU) & 1) == 0) break;
      local_e8 = &iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax>::iterator_base<const_slang::syntax::StructurePatternMemberSyntax_*>,_false>
                  ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax>::iterator_base<const_slang::syntax::StructurePatternMemberSyntax_*>,_false>
                               *)0x8fcc70)->super_SyntaxNode;
      slang::syntax::SyntaxNode::as<slang::syntax::OrderedStructurePatternMemberSyntax>(local_e8);
      __addr = (sockaddr *)
               not_null<slang::syntax::PatternSyntax_*>::operator*
                         ((not_null<slang::syntax::PatternSyntax_*> *)0x8fccb6);
      uVar1 = local_20;
      local_f0 = __addr;
      iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_false>::
      operator->((iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_false>
                  *)0x8fccfd);
      pTVar5 = ValueSymbol::getType((ValueSymbol *)0x8fcd14);
      iVar3 = Pattern::bind((int)uVar1,__addr,(socklen_t)pTVar5);
      local_f8 = (Pattern *)CONCAT44(extraout_var,iVar3);
      bVar2 = Pattern::bad(local_f8);
      local_29 = local_29 & 1 | bVar2;
      local_110 = iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_false>
                  ::operator*((iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_false>
                               *)0x8fcda1);
      not_null<const_slang::ast::FieldSymbol_*>::not_null<const_slang::ast::FieldSymbol_*>
                (&local_108,&local_110);
      local_118 = local_f8;
      not_null<const_slang::ast::Pattern_*>::not_null<slang::ast::Pattern_*>(&local_100,&local_118);
      SmallVectorBase<slang::ast::StructurePattern::FieldPattern>::push_back
                ((SmallVectorBase<slang::ast::StructurePattern::FieldPattern> *)
                 in_stack_fffffffffffffcc0,(FieldPattern *)in_stack_fffffffffffffcb8);
      local_120 = (Symbol *)
                  iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_false>
                  ::
                  operator++<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>_>
                            (in_stack_fffffffffffffcc8,
                             (int)((ulong)in_stack_fffffffffffffcc0 >> 0x20));
      iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax>::iterator_base<const_slang::syntax::StructurePatternMemberSyntax_*>,_false>
      ::
      operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax>::iterator_base<const_slang::syntax::StructurePatternMemberSyntax_*>_>
                ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax>::iterator_base<const_slang::syntax::StructurePatternMemberSyntax_*>,_false>
                  *)in_stack_fffffffffffffcc0);
    }
  }
  else {
    local_128 = local_10 + 0x28;
    local_138 = slang::syntax::SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax>::
                begin((SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax> *)0x8fce9f);
    local_148 = slang::syntax::SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax>::end
                          ((SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax> *)
                           0x8fcede);
    while( true ) {
      bVar2 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax>::iterator_base<const_slang::syntax::StructurePatternMemberSyntax_*>_>
                        ((self_type *)in_stack_fffffffffffffcc0,
                         (iterator_base<const_slang::syntax::StructurePatternMemberSyntax_*> *)
                         in_stack_fffffffffffffcb8);
      src = extraout_RDX_00;
      if (((bVar2 ^ 0xffU) & 1) == 0) break;
      local_150 = &iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax>::iterator_base<const_slang::syntax::StructurePatternMemberSyntax_*>,_false>
                   ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax>::iterator_base<const_slang::syntax::StructurePatternMemberSyntax_*>,_false>
                                *)0x8fcf4d)->super_SyntaxNode;
      local_158 = slang::syntax::SyntaxNode::as<slang::syntax::NamedStructurePatternMemberSyntax>
                            (local_150);
      sVar6 = parsing::Token::valueText((Token *)in_stack_fffffffffffffcd0);
      name._M_str = sVar6._M_str;
      name._M_len = (size_t)in_stack_fffffffffffffd20;
      local_188 = sVar6;
      local_168 = sVar6;
      in_stack_fffffffffffffd20 = Scope::find((Scope *)in_stack_fffffffffffffd18,name);
      local_170 = in_stack_fffffffffffffd20;
      in_stack_fffffffffffffd18 = Symbol::as<slang::ast::FieldSymbol>((Symbol *)0x8fd017);
      uVar1 = local_20;
      local_190 = in_stack_fffffffffffffd18;
      in_stack_fffffffffffffd10 =
           &not_null<slang::syntax::PatternSyntax_*>::operator*
                      ((not_null<slang::syntax::PatternSyntax_*> *)0x8fd049)->super_SyntaxNode;
      pTVar5 = ValueSymbol::getType((ValueSymbol *)0x8fd05d);
      iVar3 = Pattern::bind((int)uVar1,(sockaddr *)in_stack_fffffffffffffd10,(socklen_t)pTVar5);
      local_198 = (Pattern *)CONCAT44(extraout_var_00,iVar3);
      in_stack_fffffffffffffcf7 = Pattern::bad(local_198);
      local_29 = local_29 & 1 | in_stack_fffffffffffffcf7;
      local_1b0 = local_190;
      not_null<const_slang::ast::FieldSymbol_*>::not_null<const_slang::ast::FieldSymbol_*>
                (&local_1a8,&local_1b0);
      local_1b8 = local_198;
      not_null<const_slang::ast::Pattern_*>::not_null<slang::ast::Pattern_*>(&local_1a0,&local_1b8);
      SmallVectorBase<slang::ast::StructurePattern::FieldPattern>::push_back
                ((SmallVectorBase<slang::ast::StructurePattern::FieldPattern> *)
                 in_stack_fffffffffffffcc0,(FieldPattern *)in_stack_fffffffffffffcb8);
      iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax>::iterator_base<const_slang::syntax::StructurePatternMemberSyntax_*>,_false>
      ::
      operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax>::iterator_base<const_slang::syntax::StructurePatternMemberSyntax_*>_>
                ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax>::iterator_base<const_slang::syntax::StructurePatternMemberSyntax_*>,_false>
                  *)in_stack_fffffffffffffcc0);
    }
  }
  iVar3 = SmallVectorBase<slang::ast::StructurePattern::FieldPattern>::copy
                    (local_90,(EVP_PKEY_CTX *)local_28,src);
  args = (span<slang::ast::StructurePattern::FieldPattern,_18446744073709551615UL> *)
         CONCAT44(extraout_var_01,iVar3);
  args_1 = extraout_RDX_01;
  slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffd10);
  local_8 = (Compilation *)
            BumpAllocator::
            emplace<slang::ast::StructurePattern,std::span<slang::ast::StructurePattern::FieldPattern,18446744073709551615ul>,slang::SourceRange>
                      ((BumpAllocator *)
                       CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),args,args_1);
  if ((local_29 & 1) != 0) {
    local_8 = (Compilation *)Pattern::badPattern(local_8,in_stack_fffffffffffffcb8);
  }
  SmallVector<slang::ast::StructurePattern::FieldPattern,_4UL>::~SmallVector
            ((SmallVector<slang::ast::StructurePattern::FieldPattern,_4UL> *)0x8fd239);
  return (Pattern *)local_8;
}

Assistant:

Pattern& StructurePattern::fromSyntax(const StructurePatternSyntax& syntax, const Type& targetType,
                                      const ASTContext& context) {
    auto& comp = context.getCompilation();
    SLANG_ASSERT(targetType.isStruct() && !syntax.members.empty());

    bool bad = false;
    auto& structScope = targetType.getCanonicalType().as<Scope>();

    SmallVector<FieldPattern, 4> patterns;
    if (syntax.members[0]->kind == SyntaxKind::OrderedStructurePatternMember) {
        auto fields = structScope.membersOfType<FieldSymbol>();
        auto it = fields.begin();
        for (auto memberSyntax : syntax.members) {
            SLANG_ASSERT(it != fields.end());

            auto& patternSyntax = *memberSyntax->as<OrderedStructurePatternMemberSyntax>().pattern;
            auto& pattern = bind(context, patternSyntax, it->getType());
            bad |= pattern.bad();

            patterns.push_back({&(*it), &pattern});
            it++;
        }

        SLANG_ASSERT(it == fields.end());
    }
    else {
        for (auto memberSyntax : syntax.members) {
            auto& nspms = memberSyntax->as<NamedStructurePatternMemberSyntax>();
            auto memberName = nspms.name.valueText();
            auto member = structScope.find(memberName);
            SLANG_ASSERT(member);

            auto& field = member->as<FieldSymbol>();
            auto& pattern = bind(context, *nspms.pattern, field.getType());
            bad |= pattern.bad();

            patterns.push_back({&field, &pattern});
        }
    }

    auto result = comp.emplace<StructurePattern>(patterns.copy(comp), syntax.sourceRange());
    if (bad)
        return badPattern(comp, result);

    return *result;
}